

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O2

int fy_node_hash_internal(fy_node *fyn,fy_hash_update_fn update_fn,void *state)

{
  fy_node_pair *pfVar1;
  size_t len;
  long lVar2;
  uint uVar3;
  XXH_errorcode XVar4;
  XXH_errorcode extraout_EAX;
  fy_iter_chunk *curr;
  void *extraout_RDX;
  void *state_00;
  void *extraout_RDX_00;
  void *state_01;
  void *state_02;
  char *input;
  ulong uVar5;
  ulong uVar6;
  fy_node *pfVar7;
  size_t sStack_250;
  undefined1 local_248 [8];
  fy_token_iter iter;
  
  if (fyn != (fy_node *)0x0) {
    uVar3 = (byte)fyn->field_0x34 & 3;
    XVar4 = (&switchD_001231e1::switchdataD_0013f070)[uVar3] + 0x13f070;
    switch(uVar3) {
    case 0:
      input = "s";
      if (fyn->style == FYNS_ALIAS) {
        input = "A";
      }
      sStack_250 = 0x123205;
      XXH32_update((XXH32_state_t *)update_fn,input,1);
      sStack_250 = 0x123218;
      fy_token_iter_start((fyn->field_12).scalar,(fy_token_iter *)local_248);
      curr = (fy_iter_chunk *)0x0;
      while( true ) {
        sStack_250 = 0x12322d;
        curr = fy_token_iter_chunk_next((fy_token_iter *)local_248,curr,(int *)&iter.field_0x204);
        if (curr == (fy_iter_chunk *)0x0) break;
        sStack_250 = 0x123248;
        XXH32_update((XXH32_state_t *)update_fn,curr->str,curr->len);
      }
      sStack_250 = 0x123359;
      fy_token_iter_finish((fy_token_iter *)local_248);
      XVar4 = extraout_EAX;
      break;
    case 1:
      sStack_250 = 0x12327c;
      XVar4 = XXH32_update((XXH32_state_t *)update_fn,"S",1);
      state_00 = extraout_RDX;
      pfVar7 = (fy_node *)&fyn->field_12;
      while( true ) {
        pfVar7 = (fy_node *)(pfVar7->node).next;
        if (pfVar7 == (fy_node *)&fyn->field_12) {
          pfVar7 = (fy_node *)0x0;
        }
        if (pfVar7 == (fy_node *)0x0) break;
        sStack_250 = 0x1232a4;
        XVar4 = fy_node_hash_internal(pfVar7,update_fn,state_00);
        state_00 = extraout_RDX_00;
      }
      break;
    case 2:
      sStack_250 = 0x1232ae;
      uVar3 = fy_node_mapping_item_count(fyn);
      lVar2 = -((long)(int)uVar3 * 8 + 0x17U & 0xfffffffffffffff0);
      uVar5 = 0;
      *(undefined8 *)(local_248 + lVar2 + -8) = 0x1232dc;
      fy_node_mapping_perform_sort
                (fyn,(fy_node_mapping_sort_fn)0x0,(void *)0x0,(fy_node_pair **)(local_248 + lVar2),
                 uVar3);
      *(undefined8 *)(local_248 + lVar2 + -8) = 1;
      len = *(size_t *)(local_248 + lVar2 + -8);
      *(undefined8 *)(local_248 + lVar2 + -8) = 0x1232f2;
      XVar4 = XXH32_update((XXH32_state_t *)update_fn,"M",len);
      uVar6 = 0;
      if (0 < (int)uVar3) {
        uVar6 = (ulong)uVar3;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        pfVar1 = *(fy_node_pair **)((long)(local_248 + lVar2) + uVar5 * 8);
        *(undefined8 *)(local_248 + lVar2 + -8) = 0x12331e;
        XXH32_update((XXH32_state_t *)update_fn,"K",len);
        pfVar7 = pfVar1->key;
        *(undefined8 *)(local_248 + lVar2 + -8) = 0x12332a;
        fy_node_hash_internal(pfVar7,update_fn,state_01);
        *(undefined8 *)(local_248 + lVar2 + -8) = 0x12333c;
        XXH32_update((XXH32_state_t *)update_fn,"V",len);
        pfVar7 = pfVar1->value;
        *(undefined8 *)(local_248 + lVar2 + -8) = 0x123348;
        XVar4 = fy_node_hash_internal(pfVar7,update_fn,state_02);
      }
    }
    return XVar4;
  }
  sStack_250 = 1;
  XVar4 = XXH32_update((XXH32_state_t *)update_fn,"s",1);
  return XVar4;
}

Assistant:

static int
fy_node_hash_internal(struct fy_node *fyn, fy_hash_update_fn update_fn, void *state) {
    struct fy_node *fyni;
    struct fy_node_pair *fynp;
    struct fy_node_pair **fynpp;
    struct fy_token_iter iter;
    int i, count, rc;
    const struct fy_iter_chunk *ic;

    if (!fyn) {
        /* NULL */
        update_fn(state, "s", 1);    /* as zero length scalar */
        return 0;
    }

    switch (fyn->type) {
        case FYNT_SEQUENCE:
            /* SEQUENCE */
            update_fn(state, "S", 1);

            for (fyni = fy_node_list_head(&fyn->sequence); fyni;
                 fyni = fy_node_next(&fyn->sequence, fyni)) {

                rc = fy_node_hash_internal(fyni, update_fn, state);
                if (rc)
                    return rc;
            }

            break;

        case FYNT_MAPPING:
            count = fy_node_mapping_item_count(fyn);

            fynpp = alloca(sizeof(*fynpp) * (count + 1));
            fy_node_mapping_perform_sort(fyn, NULL, NULL, fynpp, count);

            /* MAPPING */
            update_fn(state, "M", 1);

            for (i = 0; i < count; i++) {
                fynp = fynpp[i];

                /* MAPPING KEY */
                update_fn(state, "K", 1);
                rc = fy_node_hash_internal(fynp->key, update_fn, state);
                if (rc)
                    return rc;

                /* MAPPING VALUE */
                update_fn(state, "V", 1);
                rc = fy_node_hash_internal(fynp->value, update_fn, state);
                if (rc)
                    return rc;
            }

            break;

        case FYNT_SCALAR:
            update_fn(state, !fy_node_is_alias(fyn) ? "s" : "A", 1);

            fy_token_iter_start(fyn->scalar, &iter);
            ic = NULL;
            while ((ic = fy_token_iter_chunk_next(&iter, ic, &rc)) != NULL)
                update_fn(state, ic->str, ic->len);
            fy_token_iter_finish(&iter);

            break;
    }

    return 0;
}